

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_type_demo.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n------------- value type graph -------------\n",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  ValueTypeGraphDemo();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n------------- pointer type graph -------------\n",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  PointerTypeGraphDemo();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n------------- shared pointer type graph -------------\n",0x37)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  std::cout << "\n------------- value type graph -------------\n" << std::endl;
  ValueTypeGraphDemo();

  std::cout << "\n------------- pointer type graph -------------\n"
            << std::endl;
  PointerTypeGraphDemo();

  std::cout << "\n------------- shared pointer type graph -------------\n"
            << std::endl;
  //   SharedPtrTypeGraphDemo();

  return 0;
}